

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::ControlFlowWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan
               (Fixer *self,Expression **currp)

{
  Expression *pEVar1;
  ulong uVar2;
  
  pEVar1 = *currp;
  uVar2 = (ulong)pEVar1->_id;
  if ((uVar2 < 0x32) && ((0x200000000000eU >> (uVar2 & 0x3f) & 1) != 0)) {
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               doPostVisitControlFlow,currp);
  }
  PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::scan(self,currp);
  uVar2 = (ulong)pEVar1->_id;
  if ((uVar2 < 0x32) && ((0x200000000000eU >> (uVar2 & 0x3f) & 1) != 0)) {
    Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>::pushTask
              ((Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_> *)self,
               doPreVisitControlFlow,currp);
    return;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }